

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_3370a6::UsageRequirementProperty::Write<cmValue>
          (UsageRequirementProperty *this,cmTargetInternals *impl,optional<cmListFileBacktrace> *bt,
          string *prop,cmValue value,Action action)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  bool bVar1;
  Action action_local;
  string *prop_local;
  optional<cmListFileBacktrace> *bt_local;
  cmTargetInternals *impl_local;
  UsageRequirementProperty *this_local;
  cmValue value_local;
  
  __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
        std::__cxx11::string::operator_cast_to_basic_string_view((string *)prop);
  bVar1 = std::operator==(__x,(this->Name).super_string_view);
  if (bVar1) {
    WriteDirect<cmValue>(this,impl,bt,value,action);
  }
  return bVar1;
}

Assistant:

bool UsageRequirementProperty::Write(
  cmTargetInternals const* impl, cm::optional<cmListFileBacktrace> const& bt,
  const std::string& prop, ValueType value, Action action)
{
  if (prop == this->Name) {
    this->WriteDirect(impl, bt, value, action);
    return true;
  }
  return false;
}